

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_longest_match_inc.h
# Opt level: O0

void InitializeH5(HasherCommon *common,H5 *self,BrotliEncoderParams *params)

{
  BrotliEncoderParams *params_local;
  H5 *self_local;
  HasherCommon *common_local;
  
  self->common_ = common;
  self->hash_shift_ = 0x20 - (common->params).bucket_bits;
  self->bucket_size_ = 1L << ((byte)(common->params).bucket_bits & 0x3f);
  self->block_size_ = 1L << ((byte)(common->params).block_bits & 0x3f);
  self->block_mask_ = (int)self->block_size_ - 1;
  self->num_ = (uint16_t *)common->extra;
  self->buckets_ = (uint32_t *)(self->num_ + self->bucket_size_);
  self->block_bits_ = (common->params).block_bits;
  self->num_last_distances_to_check_ = (common->params).num_last_distances_to_check;
  return;
}

Assistant:

static void FN(Initialize)(
    HasherCommon* common, HashLongestMatch* BROTLI_RESTRICT self,
    const BrotliEncoderParams* params) {
  self->common_ = common;

  BROTLI_UNUSED(params);
  self->hash_shift_ = 32 - common->params.bucket_bits;
  self->bucket_size_ = (size_t)1 << common->params.bucket_bits;
  self->block_size_ = (size_t)1 << common->params.block_bits;
  self->block_mask_ = (uint32_t)(self->block_size_ - 1);
  self->num_ = (uint16_t*)common->extra;
  self->buckets_ = (uint32_t*)(&self->num_[self->bucket_size_]);
  self->block_bits_ = common->params.block_bits;
  self->num_last_distances_to_check_ =
      common->params.num_last_distances_to_check;
}